

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O3

char ** apprun_shell_split_arguments(char *str)

{
  long lVar1;
  _Bool _Var2;
  uint uVar3;
  size_t sVar4;
  char **ppcVar5;
  ushort **ppuVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  byte *itr;
  char buffer [1024];
  ulong local_440;
  char local_438 [1032];
  
  if (str == (char *)0x0) {
    return (char **)0x0;
  }
  sVar4 = strlen(str);
  ppcVar5 = (char **)calloc(sVar4 + 1,8);
  local_440 = 0;
  memset(local_438,0,0x400);
  uVar9 = (ulong)(byte)*str;
  if (*str != 0) {
    ppuVar6 = __ctype_b_loc();
    do {
      lVar8 = 0;
      do {
        if ((*(byte *)((long)*ppuVar6 + (long)(char)uVar9 * 2 + 1) & 0x20) == 0) {
          if ((char)uVar9 == '\"') {
            pcVar7 = apprun_string_consume_until((char *)((byte *)str + lVar8 + 1),"\"");
            strncat(local_438,(char *)((byte *)str + lVar8 + 1),
                    (size_t)(pcVar7 + (~(ulong)str - lVar8)));
            str = pcVar7 + 1;
            goto LAB_0010528a;
          }
          uVar3 = (uint)uVar9 & 0xff;
          if (uVar3 == 0x27) {
            pcVar7 = apprun_string_consume_until((char *)((byte *)str + lVar8 + 1),"\'");
            strncat(local_438,(char *)((byte *)str + lVar8 + 1),
                    (size_t)(pcVar7 + (~(ulong)str - lVar8)));
            str = pcVar7 + 1;
            goto LAB_0010528a;
          }
          if (uVar3 == 0x5c) {
            strncat(local_438,(char *)((byte *)str + lVar8 + 1),1);
            str = (char *)((byte *)str + lVar8 + 2);
            goto LAB_0010528a;
          }
          break;
        }
        lVar1 = lVar8 + 1;
        uVar9 = (ulong)((byte *)str)[lVar1];
        lVar8 = lVar8 + 1;
      } while (((byte *)str)[lVar1] != 0);
      itr = (byte *)str + lVar8;
      str = apprun_string_consume_until((char *)itr,"\"\'\\ \t");
      strncat(local_438,(char *)itr,(long)str - (long)itr);
LAB_0010528a:
      uVar9 = (ulong)*str;
      if ((uVar9 == 0) || (((*ppuVar6)[uVar9] & 0x2000) != 0)) {
        _Var2 = apprun_string_is_all_blanks(local_438);
        if (!_Var2) {
          pcVar7 = apprun_string_trim(local_438);
          ppcVar5[local_440] = pcVar7;
          local_440 = (ulong)((int)local_440 + 1);
        }
        memset(local_438,0,0x400);
        uVar9 = (ulong)(byte)*str;
      }
    } while ((char)uVar9 != '\0');
  }
  return ppcVar5;
}

Assistant:

char **apprun_shell_split_arguments(char const *str) {
    if (str == NULL)
        return NULL;

    static const char single_quote_delimiter[] = "\'";
    static const char double_quote_delimiter[] = "\"";
    static const char regular_quote_delimiter[] = "\"\'\\ \t";

    char **splits = calloc(strlen(str) + 1, sizeof(char *));
    unsigned split_count = 0;

    const char *begin = str;
    const char *end = str;
    char buffer[1024] = {0x0};

    while (*begin != '\0') {
        begin = apprun_string_consume_spaces(begin);
        bool consumed = false;

        if (*begin == '\\') {
            strncat(buffer, begin + 1, 1);
            end = begin + 2;
            consumed = true;
        }

        if (!consumed && *begin == '\'') {
            end = apprun_string_consume_until(begin + 1, single_quote_delimiter);
            strncat(buffer, begin + 1, end - begin - 1);
            consumed = true;

            end++;
        }

        if (!consumed && *begin == '\"') {
            end = apprun_string_consume_until(begin + 1, double_quote_delimiter);
            strncat(buffer, begin + 1, end - begin - 1);
            consumed = true;

            end++;
        }

        if (!consumed && *begin != '\'' && *begin != '\"' && *begin != '\\') {
            end = apprun_string_consume_until(begin, regular_quote_delimiter);
            strncat(buffer, begin, end - begin);
        }

        if (isspace(*end) || *end == 0) {
            if (!apprun_string_is_all_blanks(buffer)) {
                splits[split_count] = apprun_string_trim(buffer);
                split_count++;
            }

            memset(buffer, 0, 1024);
        }

        begin = end;
    }

    return splits;
}